

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupDfs(Aig_Man_t *p)

{
  uint uVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar5;
  Tim_Man_t *pTVar6;
  int iVar7;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  iVar7 = p->nConstrs;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = iVar7;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar3;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    ppAVar4 = (Aig_Obj_t **)calloc((long)p->vObjs->nSize,8);
    p_00->pEquivs = ppAVar4;
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    ppAVar4 = (Aig_Obj_t **)calloc((long)p->vObjs->nSize,8);
    p_00->pReprs = ppAVar4;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  iVar7 = 0;
  do {
    if (p->vObjs->nSize <= iVar7) {
      if (p->pEquivs == (Aig_Obj_t **)0x0) {
        if ((p->nObjs[4] == 0) && (p->nObjs[6] + p->nObjs[5] != p_00->nObjs[6] + p_00->nObjs[5])) {
          __assert_fail("p->pEquivs != NULL || Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                        ,0x25a,"Aig_Man_t *Aig_ManDupDfs(Aig_Man_t *)");
        }
        if (p->pReprs == (Aig_Obj_t **)0x0) {
          uVar1 = Aig_ManCleanup(p_00);
          if (uVar1 != 0) {
            printf("Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n",(ulong)uVar1
                  );
          }
        }
      }
      Aig_ManSetRegNum(p_00,p->nRegs);
      if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
        pTVar6 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
        p_00->pManTime = pTVar6;
      }
      iVar7 = Aig_ManCheck(p_00);
      if (iVar7 == 0) {
        puts("Aig_ManDupDfs(): The check has failed.");
      }
      return p_00;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar7);
    if (pObj != (Aig_Obj_t *)0x0) {
      uVar1 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
      if (uVar1 == 3) {
        Aig_ManDupDfs_rec(p_00,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
        pAVar5 = Aig_ObjChild0Copy(pObj);
        pAVar5 = Aig_ObjCreateCo(p_00,pAVar5);
      }
      else {
        if (uVar1 != 2) goto LAB_00575882;
        pAVar5 = Aig_ObjCreateCi(p_00);
        *(ulong *)&pAVar5->field_0x18 =
             *(ulong *)&pAVar5->field_0x18 & 0xff000000ffffffff |
             *(ulong *)&pObj->field_0x18 & 0xffffff00000000;
      }
      (pObj->field_5).pData = pAVar5;
    }
LAB_00575882:
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManDupDfs( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i, nNodes;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // duplicate representation of choice nodes
    if ( p->pEquivs )
        pNew->pEquivs = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
    if ( p->pReprs )
        pNew->pReprs = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
            pObj->pData = pObjNew;
        }
        else if ( Aig_ObjIsCo(pObj) )
        {
            Aig_ManDupDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );        
//            assert( pObj->Level == ((Aig_Obj_t*)pObj->pData)->Level );
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
            pObj->pData = pObjNew;
        }
    }
    assert( p->pEquivs != NULL || Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    if ( p->pEquivs == NULL && p->pReprs == NULL && (nNodes = Aig_ManCleanup( pNew )) )
        printf( "Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupDfs(): The check has failed.\n" );
    return pNew;
}